

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void secp256k1_int_cmov(int *r,int *a,int flag)

{
  int vflag;
  
  if ((-1 < *r) && (-1 < *a)) {
    *r = *a & -flag | flag + 0x7fffffffU & *r;
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/util.h"
          ,0x109,"test condition failed: *r >= 0 && *a >= 0");
  abort();
}

Assistant:

static SECP256K1_INLINE void secp256k1_int_cmov(int *r, const int *a, int flag) {
    unsigned int mask0, mask1, r_masked, a_masked;
    /* Access flag with a volatile-qualified lvalue.
       This prevents clang from figuring out (after inlining) that flag can
       take only be 0 or 1, which leads to variable time code. */
    volatile int vflag = flag;

    /* Casting a negative int to unsigned and back to int is implementation defined behavior */
    VERIFY_CHECK(*r >= 0 && *a >= 0);

    mask0 = (unsigned int)vflag + ~0u;
    mask1 = ~mask0;
    r_masked = ((unsigned int)*r & mask0);
    a_masked = ((unsigned int)*a & mask1);

    *r = (int)(r_masked | a_masked);
}